

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

void setup_for_execution_pedigree(__cilkrts_worker *w)

{
  uint uVar1;
  uint *puVar2;
  long in_RDI;
  __cilkrts_stack_frame *sf;
  int pedigree_unsynched;
  
  puVar2 = *(uint **)(in_RDI + 0x48);
  if (puVar2 == (uint *)0x0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                  ,0x55d,"NULL != sf");
  }
  if (*puVar2 >> 0x18 != 0) {
    uVar1 = *puVar2;
    *puVar2 = *puVar2 & 0xffffffdf;
    if ((*(int *)(*(long *)(in_RDI + 0x38) + 0x1a8) != 0) || ((uVar1 & 0x20) != 0)) {
      if (*(int *)(*(long *)(in_RDI + 0x38) + 0x1a8) == 0) {
        *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(puVar2 + 0x14);
      }
      else {
        *(long *)(in_RDI + 0x60) = *(long *)(puVar2 + 0x14) + 1;
      }
    }
    *(undefined8 *)(in_RDI + 0x68) = *(undefined8 *)(puVar2 + 0x16);
    *(undefined4 *)(*(long *)(in_RDI + 0x38) + 0x1a8) = 0;
  }
  return;
}

Assistant:

static void setup_for_execution_pedigree(__cilkrts_worker *w)
{
    int pedigree_unsynched;
    __cilkrts_stack_frame *sf = w->current_stack_frame;

    CILK_ASSERT(NULL != sf);

    // If this isn't an ABI 1 or later frame, there's no pedigree information
    if (0 == CILK_FRAME_VERSION_VALUE(sf->flags))
        return;

    // Note whether the pedigree is unsynched and clear the flag before
    // we forget
    pedigree_unsynched = sf->flags & CILK_FRAME_SF_PEDIGREE_UNSYNCHED;
    sf->flags &= ~CILK_FRAME_SF_PEDIGREE_UNSYNCHED;

    // If we're just marshalling onto this worker, do not increment
    // the rank since that wouldn't happen in a sequential execution
    if (w->l->work_stolen || pedigree_unsynched)
    {
        if (w->l->work_stolen)
            w->pedigree.rank = sf->parent_pedigree.rank + 1;
        else
            w->pedigree.rank = sf->parent_pedigree.rank;
    }

    w->pedigree.parent = sf->parent_pedigree.parent;
    w->l->work_stolen = 0;
}